

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O1

DWORD * __thiscall
MIDISong2::MakeEvents(MIDISong2 *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  DWORD *pDVar6;
  DWORD *pDVar7;
  TrackInfo *pTVar8;
  DWORD delay;
  DWORD DVar9;
  long lVar10;
  bool bVar11;
  bool sysex_noroom;
  bool local_49;
  DWORD local_48;
  uint local_44;
  DWORD *local_40;
  DWORD *local_38;
  
  if ((events < max_event_p) && (this->TrackDue != (TrackInfo *)0x0)) {
    local_44 = 0;
    delay = 0;
    local_48 = max_time;
    local_40 = events;
    do {
      DVar9 = this->TrackDue->Delay;
      iVar2 = (this->super_MIDIStreamer).Tempo;
      uVar3 = (this->super_MIDIStreamer).Division;
      iVar4 = this->NumTracks;
      if (0 < (long)iVar4) {
        pTVar8 = this->Tracks;
        lVar10 = 0;
        do {
          if ((&pTVar8->Finished)[lVar10] == false) {
            piVar1 = (int *)((long)&pTVar8->Delay + lVar10);
            *piVar1 = *piVar1 - DVar9;
            piVar1 = (int *)((long)&pTVar8->PlayedTime + lVar10);
            *piVar1 = *piVar1 + DVar9;
          }
          lVar10 = lVar10 + 0x40;
        } while ((long)iVar4 * 0x40 != lVar10);
      }
      delay = delay + DVar9;
      local_44 = local_44 + (iVar2 * DVar9) / uVar3;
      DVar9 = delay;
      do {
        local_49 = false;
        pDVar7 = SendCommand(this,events,this->TrackDue,delay,(long)max_event_p - (long)events >> 2,
                             &local_49);
        bVar5 = local_49;
        pDVar6 = events;
        if (local_49 == false) {
          pTVar8 = FindNextDue(this);
          this->TrackDue = pTVar8;
          bVar11 = pDVar7 != events;
          events = pDVar7;
          delay = DVar9;
          pDVar6 = local_38;
          if (bVar11) {
            delay = 0;
            DVar9 = 0;
          }
        }
        local_38 = pDVar6;
        if (bVar5 != false) {
          return local_38;
        }
        pTVar8 = this->TrackDue;
      } while (((pTVar8 != (TrackInfo *)0x0) && (events < max_event_p)) && (pTVar8->Delay == 0));
    } while ((events == local_40 && pTVar8 != (TrackInfo *)0x0) ||
            (((events < max_event_p && (this->TrackDue != (TrackInfo *)0x0)) &&
             (delay = 0, local_44 <= local_48))));
  }
  return events;
}

Assistant:

DWORD *MIDISong2::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (TrackDue && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = TrackDue->Delay;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceTracks(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, TrackDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				TrackDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (TrackDue && TrackDue->Delay == 0 && events < max_event_p);
		}
		while (start_events == events && TrackDue);
		time = 0;
	}
	return events;
}